

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_utils.c
# Opt level: O3

void CGTFS_FileUtils(void)

{
  FILE *pFVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FILE *pFVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  char **record_values;
  char **field_names;
  char **local_50;
  char **local_48;
  int local_40;
  int local_3c;
  FILE *local_38;
  
  iVar3 = greatest_test_pre("file_utils_read_header_0");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/agency.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0xe;
        greatest_info.msg = "Couldn\'t open `data/agency.txt` test file";
      }
      else {
        uVar4 = read_header((FILE *)pFVar6,&local_48);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 6) {
          lVar7 = 0;
          do {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar3 = greatest_do_assert_equal_t
                              ((void *)((long)&DAT_001f1134 +
                                       (long)*(int *)((long)&DAT_001f1134 + lVar7)),
                               *(void **)((long)local_48 + lVar7 * 2),&greatest_type_info_string,
                               (void *)0x0);
            ppcVar2 = local_48;
            if (iVar3 == 0) {
              greatest_info.fail_line = 0x21;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
                greatest_info.msg = "type_info->equal callback missing!";
              }
              else {
                greatest_info.msg = "correct_field_names[i] != field_names[i]";
              }
              goto joined_r0x0011ddf2;
            }
            lVar7 = lVar7 + 4;
          } while (lVar7 != 0x18);
          if (local_48 != (char **)0x0) {
            lVar7 = 0;
            do {
              free(ppcVar2[lVar7]);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 6);
            free(ppcVar2);
          }
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_0011dee6;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",6);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x1e;
        greatest_info.msg = "Counted wrong number of fields in the header";
      }
joined_r0x0011ddf2:
      iVar3 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
    }
LAB_0011dee6:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_read_header_1");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/routes.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0x2d;
        greatest_info.msg = "Couldn\'t open `data/routes.txt` test file";
      }
      else {
        uVar4 = read_header((FILE *)pFVar6,&local_48);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 7) {
          lVar7 = 0;
          do {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar3 = greatest_do_assert_equal_t
                              ((void *)((long)&DAT_001f114c +
                                       (long)*(int *)((long)&DAT_001f114c + lVar7)),
                               *(void **)((long)local_48 + lVar7 * 2),&greatest_type_info_string,
                               (void *)0x0);
            ppcVar2 = local_48;
            if (iVar3 == 0) {
              greatest_info.fail_line = 0x41;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
                greatest_info.msg = "type_info->equal callback missing!";
              }
              else {
                greatest_info.msg = "correct_field_names[i] != field_names[i]";
              }
              goto joined_r0x0011e013;
            }
            lVar7 = lVar7 + 4;
          } while (lVar7 != 0x1c);
          if (local_48 != (char **)0x0) {
            lVar7 = 0;
            do {
              free(ppcVar2[lVar7]);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 7);
            free(ppcVar2);
          }
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_0011e107;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",7);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x3e;
        greatest_info.msg = "Counted wrong number of fields in the header";
      }
joined_r0x0011e013:
      iVar3 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
    }
LAB_0011e107:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_read_header_2_empty");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/empty.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0x4c;
        greatest_info.msg = "Couldn\'t open `data/empty.txt` test file";
      }
      else {
        local_48 = (char **)0x0;
        uVar4 = read_header((FILE *)pFVar6,&local_48);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 0xffffffff) {
          if (local_48 != (char **)0x0) {
            free(local_48);
          }
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_0011e28d;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x52;
        greatest_info.msg = "Counted some fields in an empty header";
      }
      iVar3 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
    }
LAB_0011e28d:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_read_header_3_badfile");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/doesntexist.txt","r");
      uVar4 = read_header((FILE *)pFVar6,&local_48);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar4 == 0xffffffff) {
        if (local_48 != (char **)0x0) {
          free(local_48);
        }
        if (pFVar6 != (FILE *)0x0) {
          fclose(pFVar6);
        }
        greatest_info.msg = (char *)0x0;
        iVar3 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x61;
        greatest_info.msg = "Somehow opened the file that doesn\'t exist";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
      }
    }
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_read_record_0");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/agency.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0x72;
        greatest_info.msg = "Couldn\'t open `data/agency.txt` test file";
joined_r0x0011e856:
        iVar3 = -1;
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
      }
      else {
        iVar3 = read_header((FILE *)pFVar6,&local_48);
        local_38 = pFVar6;
        iVar5 = read_record((FILE *)pFVar6,iVar3,&local_50);
        lVar7 = (long)iVar3;
        local_40 = iVar3;
        if (0 < iVar5) {
          iVar3 = 0;
LAB_0011e461:
          if (iVar3 == 3) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar5 = greatest_do_assert_equal_t("4",*local_50,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar5 == 0) {
              greatest_info.fail_line = 0x8d;
              if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                greatest_info.msg = "\"4\" != record_values[0]";
                goto joined_r0x0011e856;
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar5 = greatest_do_assert_equal_t
                                (anon_var_dwarf_1f14,local_50[1],&greatest_type_info_string,
                                 (void *)0x0);
              if (iVar5 == 0) {
                greatest_info.fail_line = 0x8e;
                if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                  greatest_info.msg = anon_var_dwarf_1f1f;
                  goto joined_r0x0011e856;
                }
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar5 = greatest_do_assert_equal_t
                                  ("http://www.lsl.fi",local_50[2],&greatest_type_info_string,
                                   (void *)0x0);
                if (iVar5 == 0) {
                  greatest_info.fail_line = 0x8f;
joined_r0x0011ea06:
                  if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                    greatest_info.msg = "\"http://www.lsl.fi\" != record_values[2]";
                    goto joined_r0x0011e856;
                  }
                }
                else {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar5 = greatest_do_assert_equal_t
                                    ("blah \"HELLO\" blah",local_50[3],&greatest_type_info_string,
                                     (void *)0x0);
                  if (iVar5 == 0) {
                    greatest_info.fail_line = 0x90;
                    if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                      greatest_info.msg = "\"blah \\\"HELLO\\\" blah\" != record_values[3]";
                      goto joined_r0x0011e856;
                    }
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar5 = greatest_do_assert_equal_t
                                      ("fi",local_50[4],&greatest_type_info_string,(void *)0x0);
                    if (iVar5 == 0) {
                      greatest_info.fail_line = 0x91;
joined_r0x0011eb27:
                      if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                        greatest_info.msg = "\"fi\" != record_values[4]";
                        goto joined_r0x0011e856;
                      }
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar5 = greatest_do_assert_equal_t
                                        ("03 814 2355",local_50[5],&greatest_type_info_string,
                                         (void *)0x0);
                      if (iVar5 != 0) goto LAB_0011e73e;
                      greatest_info.fail_line = 0x92;
joined_r0x0011ebac:
                      if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                        greatest_info.msg = "\"03 814 2355\" != record_values[5]";
                        goto joined_r0x0011e856;
                      }
                    }
                  }
                }
              }
            }
          }
          else if (iVar3 == 2) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar5 = greatest_do_assert_equal_t("3",*local_50,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar5 == 0) {
              greatest_info.fail_line = 0x85;
              if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                greatest_info.msg = "\"3\" != record_values[0]";
                goto joined_r0x0011e856;
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar5 = greatest_do_assert_equal_t
                                ("",local_50[1],&greatest_type_info_string,(void *)0x0);
              if (iVar5 == 0) {
                greatest_info.fail_line = 0x86;
                if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                  greatest_info.msg = anon_var_dwarf_1f1f + 0x20;
                  goto joined_r0x0011e856;
                }
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar5 = greatest_do_assert_equal_t
                                  ("",local_50[2],&greatest_type_info_string,(void *)0x0);
                if (iVar5 == 0) {
                  greatest_info.fail_line = 0x87;
                  if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                    greatest_info.msg = "\"\" != record_values[2]";
                    goto joined_r0x0011e856;
                  }
                }
                else {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar5 = greatest_do_assert_equal_t
                                    ("",local_50[3],&greatest_type_info_string,(void *)0x0);
                  if (iVar5 == 0) {
                    greatest_info.fail_line = 0x88;
                    if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                      greatest_info.msg = "\"\" != record_values[3]";
                      goto joined_r0x0011e856;
                    }
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar5 = greatest_do_assert_equal_t
                                      ("",local_50[4],&greatest_type_info_string,(void *)0x0);
                    if (iVar5 == 0) {
                      greatest_info.fail_line = 0x89;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_0011ebae;
                      greatest_info.msg = "\"\" != record_values[4]";
                      goto joined_r0x0011e856;
                    }
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar5 = greatest_do_assert_equal_t
                                      ("",local_50[5],&greatest_type_info_string,(void *)0x0);
                    if (iVar5 != 0) goto LAB_0011e73e;
                    greatest_info.fail_line = 0x8a;
                    if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                      greatest_info.msg = "\"\" != record_values[5]";
                      goto joined_r0x0011e856;
                    }
                  }
                }
              }
            }
          }
          else {
            if (iVar3 != 0) {
LAB_0011e73e:
              pFVar6 = local_38;
              ppcVar2 = local_50;
              if (local_50 != (char **)0x0) {
                lVar8 = 0;
                local_3c = iVar3;
                if (0 < local_40) {
                  do {
                    free(ppcVar2[lVar8]);
                    lVar8 = lVar8 + 1;
                  } while (lVar7 != lVar8);
                }
                free(ppcVar2);
                iVar3 = local_3c;
              }
              iVar3 = iVar3 + 1;
              iVar5 = read_record((FILE *)pFVar6,local_40,&local_50);
              if (iVar5 < 1) goto LAB_0011e7a4;
              goto LAB_0011e461;
            }
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar5 = greatest_do_assert_equal_t("1",*local_50,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar5 == 0) {
              greatest_info.fail_line = 0x7d;
              if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                greatest_info.msg = "\"1\" != record_values[0]";
                goto joined_r0x0011e856;
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar5 = greatest_do_assert_equal_t
                                ("Lahden Seudun Liikenne",local_50[1],&greatest_type_info_string,
                                 (void *)0x0);
              if (iVar5 != 0) {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar5 = greatest_do_assert_equal_t
                                  ("http://www.lsl.fi",local_50[2],&greatest_type_info_string,
                                   (void *)0x0);
                if (iVar5 == 0) {
                  greatest_info.fail_line = 0x7f;
                  goto joined_r0x0011ea06;
                }
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar5 = greatest_do_assert_equal_t
                                  ("Europe/Helsinki",local_50[3],&greatest_type_info_string,
                                   (void *)0x0);
                if (iVar5 != 0) {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar5 = greatest_do_assert_equal_t
                                    ("fi",local_50[4],&greatest_type_info_string,(void *)0x0);
                  if (iVar5 == 0) {
                    greatest_info.fail_line = 0x81;
                    goto joined_r0x0011eb27;
                  }
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar5 = greatest_do_assert_equal_t
                                    ("03 814 2355",local_50[5],&greatest_type_info_string,
                                     (void *)0x0);
                  if (iVar5 == 0) {
                    greatest_info.fail_line = 0x82;
                    goto joined_r0x0011ebac;
                  }
                  goto LAB_0011e73e;
                }
                greatest_info.fail_line = 0x80;
                if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011ebae;
                greatest_info.msg = "\"Europe/Helsinki\" != record_values[3]";
                goto joined_r0x0011e856;
              }
              greatest_info.fail_line = 0x7e;
              if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                greatest_info.msg = "\"Lahden Seudun Liikenne\" != record_values[1]";
                goto joined_r0x0011e856;
              }
            }
          }
LAB_0011ebae:
          greatest_info.msg = "type_info->equal callback missing!";
          goto joined_r0x0011e856;
        }
LAB_0011e7a4:
        ppcVar2 = local_48;
        if (local_48 != (char **)0x0) {
          if (0 < local_40) {
            lVar8 = 0;
            do {
              free(ppcVar2[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar7 != lVar8);
          }
          free(ppcVar2);
        }
        ppcVar2 = local_50;
        if (local_50 != (char **)0x0) {
          if (0 < local_40) {
            lVar8 = 0;
            do {
              free(ppcVar2[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar7 != lVar8);
          }
          free(ppcVar2);
        }
        fclose(local_38);
        greatest_info.msg = (char *)0x0;
        iVar3 = 0;
      }
    }
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_read_record_1_empty");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/empty.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0xa6;
        greatest_info.msg = "Couldn\'t open `data/empty.txt` test file";
      }
      else {
        uVar4 = read_header((FILE *)pFVar6,&local_48);
        if (uVar4 == 0xffffffff) {
          greatest_info.assertions = greatest_info.assertions + 2;
          iVar3 = read_record((FILE *)pFVar6,-1,&local_50);
          if (iVar3 == -1) {
            if (local_48 != (char **)0x0) {
              free(local_48);
            }
            if (local_50 != (char **)0x0) {
              free(local_50);
            }
            fclose(pFVar6);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_0011ee57;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xffffffff);
          fwrite("\n     Got: ",0xb,1,_stdout);
          pFVar1 = _stdout;
          uVar4 = read_record((FILE *)pFVar6,-1,&local_50);
          fprintf(pFVar1,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xae;
          greatest_info.msg = "Somehow read a record that doesn\'t exist";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xffffffff);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xab;
          greatest_info.msg = "Somehow read the header of an empty file";
        }
      }
      iVar3 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
    }
LAB_0011ee57:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_read_record_2_badfile");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/doesntexist.txt","r");
      uVar4 = read_header((FILE *)pFVar6,&local_48);
      if (uVar4 == 0xffffffff) {
        greatest_info.assertions = greatest_info.assertions + 2;
        iVar3 = read_record((FILE *)pFVar6,-1,&local_50);
        if (iVar3 == -1) {
          if (local_48 != (char **)0x0) {
            free(local_48);
          }
          if (local_50 != (char **)0x0) {
            free(local_50);
          }
          if (pFVar6 != (FILE *)0x0) {
            fclose(pFVar6);
          }
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_0011f0a0;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        pFVar1 = _stdout;
        uVar4 = read_record((FILE *)pFVar6,-1,&local_50);
        fprintf(pFVar1,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_line = 0xc1;
        greatest_info.msg = "Somehow read a record from a file that doesn\'t exist";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_line = 0xbe;
        greatest_info.msg = "Somehow read the header of a nonexisting file";
      }
      iVar3 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
    }
LAB_0011f0a0:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_count_lines_0");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/agency.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0xd4;
        greatest_info.msg = "Couldn\'t open `data/agency.txt` test file";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar3 = count_lines((FILE *)pFVar6);
        if (iVar3 == 5) {
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_0011f16d;
        }
        greatest_info.fail_line = 0xd6;
        greatest_info.msg = "5 != count_lines(fp)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      iVar3 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
    }
LAB_0011f16d:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_count_lines_1");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/empty.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0xdf;
        greatest_info.msg = "Couldn\'t open `data/empty.txt` test file";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar3 = count_lines((FILE *)pFVar6);
        if (iVar3 == 0) {
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_0011f238;
        }
        greatest_info.fail_line = 0xe1;
        greatest_info.msg = "0 != count_lines(fp)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      iVar3 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
    }
LAB_0011f238:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_count_lines_2");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/only_nl.txt","r");
      if (pFVar6 == (FILE *)0x0) {
        greatest_info.fail_line = 0xea;
        greatest_info.msg = "Couldn\'t open `data/only_nl.txt` test file";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar3 = count_lines((FILE *)pFVar6);
        if (iVar3 == 2) {
          fclose(pFVar6);
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_0011f305;
        }
        greatest_info.fail_line = 0xec;
        greatest_info.msg = "2 != count_lines(fp)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      iVar3 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
    }
LAB_0011f305:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_count_lines_3_badfile");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar6 = fopen("../tests/data/doesntexist.txt","r");
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar3 = count_lines((FILE *)pFVar6);
      if (iVar3 == -1) {
        if (pFVar6 != (FILE *)0x0) {
          fclose(pFVar6);
        }
        greatest_info.msg = (char *)0x0;
        iVar3 = 0;
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0xf4;
        greatest_info.msg = "-1 != count_lines(fp)";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
      }
    }
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_list_files_1");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar4 = list_txt_files("../tests/data/google_sample",&local_48);
      ppcVar2 = local_48;
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar4 == 0xb) {
        lVar7 = 0;
        do {
          iVar3 = (&DAT_001f1168)[lVar7];
          lVar9 = 0;
          lVar8 = lVar9;
          do {
            iVar5 = strcmp(ppcVar2[lVar9],(char *)((long)&DAT_001f1168 + (long)iVar3));
            if (iVar5 == 0) {
              lVar8 = 1;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0xb);
          if ((int)lVar8 == 0) {
            greatest_info.fail_line = 0x117;
            greatest_info.msg = "An expected filename not found in the result array";
            goto LAB_0011f54b;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0xb);
        lVar7 = 0;
        do {
          free(ppcVar2[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0xb);
        free(ppcVar2);
        greatest_info.msg = (char *)0x0;
        iVar3 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xb);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x10f;
        greatest_info.msg = "CGTFS_FILE_UTILS_LIST_1_SIZE != file_count";
LAB_0011f54b:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
      }
    }
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_list_files_2_nofiles");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar4 = list_txt_files("../tests/data/no_txt_files_dir",&local_48);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar4 == 0) {
        if (local_48 != (char **)0x0) {
          free(local_48);
        }
        greatest_info.msg = (char *)0x0;
        iVar3 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x123;
        greatest_info.msg = "0 != file_count";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f783;
      }
    }
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("file_utils_list_files_3_nodir");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar4 = list_txt_files("../tests/data/dir_not_found",&local_48);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar4 == 0xffffffff) {
        greatest_info.msg = (char *)0x0;
        iVar3 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x12d;
        greatest_info.msg = "-1 != file_count";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) {
LAB_0011f783:
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
          ;
          abort();
        }
      }
    }
    greatest_test_post(iVar3);
  }
  return;
}

Assistant:

SUITE(CGTFS_FileUtils) {
    RUN_TEST(file_utils_read_header_0);
    RUN_TEST(file_utils_read_header_1);
    RUN_TEST(file_utils_read_header_2_empty);
    RUN_TEST(file_utils_read_header_3_badfile);

    RUN_TEST(file_utils_read_record_0);
    RUN_TEST(file_utils_read_record_1_empty);
    RUN_TEST(file_utils_read_record_2_badfile);

    RUN_TEST(file_utils_count_lines_0);
    RUN_TEST(file_utils_count_lines_1);
    RUN_TEST(file_utils_count_lines_2);
    RUN_TEST(file_utils_count_lines_3_badfile);

    RUN_TEST(file_utils_list_files_1);
    RUN_TEST(file_utils_list_files_2_nofiles);
    RUN_TEST(file_utils_list_files_3_nodir);
}